

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureLayerAttachmentTest::iterate
          (TextureLayerAttachmentTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  GLuint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  int local_64;
  uint local_60;
  GLint l;
  GLuint k;
  GLuint j;
  GLuint layers_counts_count;
  GLuint layers_counts [3];
  GLuint i;
  int local_34;
  byte local_2f;
  byte local_2e;
  undefined1 local_2d;
  GLint max_color_attachments;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  TextureLayerAttachmentTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar4->_vptr_RenderContext[2])();
  max_color_attachments = (GLint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)max_color_attachments);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_2d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)local_2d)) {
    local_2e = 1;
    local_2f = 0;
    local_34 = 8;
    (**(code **)(lStack_20 + 0x868))(0x8cdf,&local_34);
    err = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(err,"glGetIntegerv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x33f);
    for (layers_counts[1] = 0; layers_counts[1] < 4; layers_counts[1] = layers_counts[1] + 1) {
      j = (uint)(*(int *)(s_targets + (ulong)layers_counts[1] * 4) == 0x9009) * 5 + 1;
      layers_counts_count = 0xc0;
      layers_counts[0] = MaxTextureLayers(this,*(GLenum *)(s_targets + (ulong)layers_counts[1] * 4))
      ;
      for (l = 1; GVar3 = MaxTextureLevels(this,*(GLenum *)(s_targets + (ulong)layers_counts[1] * 4)
                                          ), (uint)l <= GVar3; l = l + 1) {
        for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
          for (local_64 = 0; local_64 < local_34; local_64 = local_64 + 1) {
            bVar1 = Test(this,local_64 + 0x8ce0,true,
                         *(GLenum *)(s_targets + (ulong)layers_counts[1] * 4),0x8058,l,
                         (&j)[local_60]);
            local_2e = bVar1 & local_2e;
            Clean(this);
          }
          if (*(int *)(s_targets + (ulong)layers_counts[1] * 4) != 0x806f) {
            bVar1 = Test(this,0x8d00,false,*(GLenum *)(s_targets + (ulong)layers_counts[1] * 4),
                         0x81a6,l,(&j)[local_60]);
            local_2e = bVar1 & local_2e;
            Clean(this);
            bVar1 = Test(this,0x821a,false,*(GLenum *)(s_targets + (ulong)layers_counts[1] * 4),
                         0x88f0,l,(&j)[local_60]);
            local_2e = bVar1 & local_2e;
            Clean(this);
            bVar1 = Test(this,0x8d20,false,*(GLenum *)(s_targets + (ulong)layers_counts[1] * 4),
                         0x8d48,l,(&j)[local_60]);
            local_2e = bVar1 & local_2e;
            Clean(this);
          }
        }
      }
    }
    Clean(this);
    if ((local_2e & 1) == 0) {
      if ((local_2f & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureLayerAttachmentTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		glw::GLint max_color_attachments = 8 /* Specification minimum OpenGL 4.5 Core Profile p. 627 */;

		gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &max_color_attachments);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

		for (glw::GLuint i = 0; i < s_targets_count; ++i)
		{
			glw::GLuint layers_counts[] = { (GL_TEXTURE_CUBE_MAP_ARRAY == (glw::GLuint)s_targets[i]) ? 6u : 1u,
											(GL_TEXTURE_CUBE_MAP_ARRAY == (glw::GLuint)s_targets[i]) ? 192u : 192u,
											MaxTextureLayers(s_targets[i]) };

			glw::GLuint layers_counts_count = sizeof(layers_counts) / sizeof(layers_counts[0]);

			for (glw::GLuint j = 1; j <= MaxTextureLevels(s_targets[i]); ++j)
			{
				for (glw::GLuint k = 0; k < layers_counts_count; ++k)
				{
					for (glw::GLint l = 0; l < max_color_attachments; ++l)
					{
						is_ok &= Test(GL_COLOR_ATTACHMENT0 + l, true, s_targets[i], GL_RGBA8, j, layers_counts[k]);
						Clean();
					}

					if (GL_TEXTURE_3D != s_targets[i])
					{
						is_ok &=
							Test(GL_DEPTH_ATTACHMENT, false, s_targets[i], GL_DEPTH_COMPONENT24, j, layers_counts[k]);
						Clean();

						is_ok &= Test(GL_DEPTH_STENCIL_ATTACHMENT, false, s_targets[i], GL_DEPTH24_STENCIL8, j,
									  layers_counts[k]);
						Clean();

						is_ok &=
							Test(GL_STENCIL_ATTACHMENT, false, s_targets[i], GL_STENCIL_INDEX8, j, layers_counts[k]);
						Clean();
					}
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}